

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# render-data.cc
# Opt level: O2

expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::tydra::(anonymous_namespace)::VertexToFaceVarying_abi_cxx11_
          (expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *src,size_t stride_bytes,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexCounts,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *faceVertexIndices)

{
  pointer puVar1;
  ulong uVar2;
  ulong uVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *args_1;
  pointer pcVar4;
  bool bVar5;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dst;
  size_t v_idx;
  size_t fv_idx;
  size_t num_vertices;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  allocator local_121;
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_120;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_f8;
  pointer local_d8;
  ulong local_d0;
  undefined1 local_c8 [8];
  ulong local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8;
  string local_98;
  long *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_58;
  string local_50 [32];
  
  local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58 = src;
  if (*(long *)this == *(long *)(this + 8)) {
    local_118.m_error._M_dataplus._M_p = "src data is empty.";
  }
  else {
    if (src != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      uVar2 = *(long *)(this + 8) - *(long *)this;
      uVar3 = uVar2 / (ulong)src;
      if (uVar2 % (ulong)src == 0) {
        local_98._M_dataplus._M_p = (pointer)0x0;
        local_98._M_string_length = 0;
        local_98.field_2._M_allocated_capacity = 0;
        args_1 = faceVertexCounts;
        local_c0 = uVar3;
        local_68 = uVar3;
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98,(size_type)src
                  );
        uVar2 = 0;
        local_d8 = (pointer)0x0;
        local_120 = __return_storage_ptr__;
        local_78 = (long *)stride_bytes;
        while( true ) {
          local_60 = uVar2;
          if ((ulong)(local_78[1] - *local_78 >> 2) <= uVar2) break;
          uVar3 = (ulong)*(uint *)(*local_78 + uVar2 * 4);
          pcVar4 = local_d8;
          local_70 = uVar3;
          while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
            puVar1 = (faceVertexCounts->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            local_c8 = (undefined1  [8])pcVar4;
            if ((pointer)((long)(faceVertexCounts->
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 2) <=
                pcVar4) {
              ::std::__cxx11::string::string
                        (local_50,"faeVertexIndex {} out-of-range at faceVertexCount[{}]",
                         (allocator *)&local_d0);
              fmt::format<unsigned_long,unsigned_long>
                        ((string *)&local_b8,(fmt *)local_50,(string *)local_c8,&local_60,
                         (unsigned_long *)args_1);
LAB_00282c73:
              __return_storage_ptr__ = local_120;
              local_118.m_error._M_dataplus._M_p = (pointer)&local_118.m_error.field_2;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_b8._M_allocated_capacity == &local_a8) {
                local_118.m_error.field_2._8_8_ = local_a8._8_8_;
              }
              else {
                local_118.m_error._M_dataplus._M_p = (pointer)local_b8._M_allocated_capacity;
              }
              local_118.m_error._M_string_length = local_b8._8_8_;
              local_b8._8_8_ = 0;
              local_a8._M_local_buf[0] = '\0';
              local_b8._M_allocated_capacity = (size_type)&local_a8;
              nonstd::expected_lite::
              expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::
              expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                        (local_120,&local_118);
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              ::std::__cxx11::string::_M_dispose();
              goto LAB_00282cf1;
            }
            local_d0 = (ulong)puVar1[(long)pcVar4];
            if (local_68 <= local_d0) {
              ::std::__cxx11::string::string
                        (local_50,"faeVertexIndices[{}] {} exceeds the number of vertices {}",
                         &local_121);
              fmt::format<unsigned_long,unsigned_long,unsigned_long>
                        ((string *)&local_b8,(fmt *)local_50,(string *)local_c8,&local_d0,&local_c0,
                         (unsigned_long *)faceVertexIndices);
              goto LAB_00282c73;
            }
            memcpy(local_98._M_dataplus._M_p,(void *)(local_d0 * (long)src + *(long *)this),
                   (size_t)src);
            ::std::vector<unsigned_char,std::allocator<unsigned_char>>::
            insert<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,void>
                      ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_f8,
                       (const_iterator)local_f8._M_impl.super__Vector_impl_data._M_finish,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_98._M_dataplus._M_p,
                       (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                        )local_98._M_string_length);
            pcVar4 = pcVar4 + 1;
          }
          local_d8 = local_d8 + local_70;
          uVar2 = uVar2 + 1;
        }
        (local_120->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .m_has_value = true;
        (local_120->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = local_f8._M_impl.super__Vector_impl_data._M_start;
        (local_120->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = local_f8._M_impl.super__Vector_impl_data._M_finish;
        (local_120->contained).
        super_storage_t_impl<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        .field_0.m_value.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_f8._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_f8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        __return_storage_ptr__ = local_120;
LAB_00282cf1:
        ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_98);
      }
      else {
        ::std::__cxx11::string::string
                  (local_50,"src size {} must be the multiple of stride_bytes {}",
                   (allocator *)&local_c0);
        local_98._M_dataplus._M_p = (pointer)(*(long *)(this + 8) - *(long *)this);
        fmt::format<unsigned_long,unsigned_long>
                  ((string *)&local_b8,(fmt *)local_50,&local_98,(unsigned_long *)&local_58,
                   (unsigned_long *)faceVertexCounts);
        local_118.m_error._M_dataplus._M_p = (pointer)&local_118.m_error.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_allocated_capacity == &local_a8) {
          local_118.m_error.field_2._8_8_ = local_a8._8_8_;
        }
        else {
          local_118.m_error._M_dataplus._M_p = (pointer)local_b8._M_allocated_capacity;
        }
        local_118.m_error._M_string_length = local_b8._8_8_;
        local_b8._8_8_ = 0;
        local_a8._M_local_buf[0] = '\0';
        local_b8._M_allocated_capacity = (size_type)&local_a8;
        nonstd::expected_lite::
        expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::
        expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (__return_storage_ptr__,&local_118);
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
        ::std::__cxx11::string::_M_dispose();
      }
      goto LAB_00282cfe;
    }
    local_118.m_error._M_dataplus._M_p = "stride_bytes must be non-zero.";
  }
  nonstd::expected_lite::
  expected<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<const_char_*,_0>(__return_storage_ptr__,(unexpected_type<const_char_*> *)&local_118);
LAB_00282cfe:
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_f8);
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<std::vector<uint8_t>, std::string> VertexToFaceVarying(
    const std::vector<uint8_t> &src, const size_t stride_bytes,
    const std::vector<uint32_t> &faceVertexCounts,
    const std::vector<uint32_t> &faceVertexIndices) {
  std::vector<uint8_t> dst;

  if (src.empty()) {
    return nonstd::make_unexpected("src data is empty.");
  }

  if (stride_bytes == 0) {
    return nonstd::make_unexpected("stride_bytes must be non-zero.");
  }

  if ((src.size() % stride_bytes) != 0) {
    return nonstd::make_unexpected(
        fmt::format("src size {} must be the multiple of stride_bytes {}",
                    src.size(), stride_bytes));
  }

  const size_t num_vertices = src.size() / stride_bytes;

  std::vector<uint8_t> buf;
  buf.resize(stride_bytes);

  size_t faceVertexIndexOffset{0};

  for (size_t i = 0; i < faceVertexCounts.size(); i++) {
    size_t cnt = faceVertexCounts[i];

    for (size_t k = 0; k < cnt; k++) {
      size_t fv_idx = k + faceVertexIndexOffset;

      if (fv_idx >= faceVertexIndices.size()) {
        return nonstd::make_unexpected(
            fmt::format("faeVertexIndex {} out-of-range at faceVertexCount[{}]",
                        fv_idx, i));
      }

      size_t v_idx = faceVertexIndices[fv_idx];

      if (v_idx >= num_vertices) {
        return nonstd::make_unexpected(fmt::format(
            "faeVertexIndices[{}] {} exceeds the number of vertices {}", fv_idx,
            v_idx, num_vertices));
      }

      memcpy(buf.data(), src.data() + v_idx * stride_bytes, stride_bytes);
      dst.insert(dst.end(), buf.begin(), buf.end());
    }

    faceVertexIndexOffset += cnt;
  }

  return dst;
}